

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::SWAP<std::complex<float>_>::matrix(SWAP<std::complex<float>_> *this)

{
  complex<float> m32;
  complex<float> m01;
  data_type extraout_RDX;
  complex<float> in_RSI;
  complex<float> in_R8;
  complex<float> in_R9;
  SquareMatrix<std::complex<float>_> SVar1;
  complex<float> in_stack_ffffffffffffff48;
  float __r;
  float __r_00;
  SquareMatrix<std::complex<float>_> *m33;
  complex<float> local_98;
  complex<float> local_90;
  complex<float> local_88;
  complex<float> local_80;
  complex<float> local_78;
  complex<float> local_70;
  complex<float> local_68;
  complex<float> local_60;
  complex<float> local_58;
  complex<float> local_50;
  complex<float> local_48;
  complex<float> local_40;
  complex<float> local_38;
  complex<float> local_30;
  complex<float> local_28;
  complex<float> local_20 [2];
  SWAP<std::complex<float>_> *this_local;
  
  __r = 1.0;
  __r_00 = 0.0;
  m33 = (SquareMatrix<std::complex<float>_> *)this;
  this_local = this;
  std::complex<float>::complex(local_20,1.0,0.0);
  std::complex<float>::complex(&local_28,__r_00,__r_00);
  std::complex<float>::complex(&local_30,__r_00,__r_00);
  std::complex<float>::complex(&local_38,__r_00,__r_00);
  std::complex<float>::complex(&local_40,__r_00,__r_00);
  std::complex<float>::complex(&local_48,__r_00,__r_00);
  std::complex<float>::complex(&local_50,__r,__r_00);
  std::complex<float>::complex(&local_58,__r_00,__r_00);
  std::complex<float>::complex(&local_60,__r_00,__r_00);
  std::complex<float>::complex(&local_68,__r,__r_00);
  std::complex<float>::complex(&local_70,__r_00,__r_00);
  std::complex<float>::complex(&local_78,__r_00,__r_00);
  std::complex<float>::complex(&local_80,__r_00,__r_00);
  std::complex<float>::complex(&local_88,__r_00,__r_00);
  std::complex<float>::complex(&local_90,__r_00,__r_00);
  std::complex<float>::complex(&local_98,__r,__r_00);
  m32._M_value._4_4_ = __r_00;
  m32._M_value._0_4_ = __r;
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (m33,in_RSI,m01,local_60,in_R8,in_R9,local_60,local_68,local_70,local_78,local_80,
             local_88,local_90,local_98,in_stack_ffffffffffffff48,m32,(complex<float>)m33);
  SVar1.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)this;
  return SVar1;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , 1 , 0 ,
                                                  0 , 1 , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
        }